

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromMappedGia(Gia_Man_t *p,int fFindEnables,int fUseBuffs)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Abc_Obj_t *pFanin;
  int *piVar8;
  Hop_Obj_t *pHVar9;
  Abc_Obj_t *pAVar10;
  Abc_NtkFunc_t Func;
  bool bVar11;
  Abc_Obj_t *pObjNodeE;
  Abc_Obj_t *pObjNodeT;
  Abc_Obj_t *pObjCtrl;
  int iTemp;
  int iCtrl;
  int iLitT;
  int iLitE;
  int iObjRo;
  int nCountMux;
  int nDupGates;
  int iFan;
  int k;
  int i;
  Vec_Ptr_t *vReflect;
  Gia_Obj_t *pObjLo;
  Gia_Obj_t *pObjLi;
  Gia_Obj_t *pObj;
  Abc_Obj_t *pConst0;
  Abc_Obj_t *pObjNewLo;
  Abc_Obj_t *pObjNewLi;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtkNew;
  int fDuplicate;
  int fVerbose;
  int fUseBuffs_local;
  int fFindEnables_local;
  Gia_Man_t *p_local;
  
  pNtkNew._4_4_ = 0;
  pNtkNew._0_4_ = 0;
  pObj = (Gia_Obj_t *)0x0;
  iLitE = 0;
  fDuplicate = fUseBuffs;
  fVerbose = fFindEnables;
  _fUseBuffs_local = p;
  iVar2 = Gia_ManHasMapping(p);
  if (((iVar2 == 0) && (_fUseBuffs_local->pMuxes == (uint *)0x0)) && (fVerbose == 0)) {
    __assert_fail("Gia_ManHasMapping(p) || p->pMuxes || fFindEnables",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2ea,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if ((fVerbose != 0) && (_fUseBuffs_local->pMuxes != (uint *)0x0)) {
    __assert_fail("!fFindEnables || !p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2eb,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  iVar2 = Gia_ManHasMapping(_fUseBuffs_local);
  Func = ABC_FUNC_SOP;
  if (iVar2 != 0) {
    Func = ABC_FUNC_AIG;
  }
  pObjNew = (Abc_Obj_t *)Abc_NtkAlloc(ABC_NTK_LOGIC,Func,1);
  pAVar5 = (Abc_Obj_t *)Extra_UtilStrsav(_fUseBuffs_local->pName);
  pObjNew->pNext = pAVar5;
  pcVar6 = Extra_UtilStrsav(_fUseBuffs_local->pSpec);
  *(char **)&pObjNew->Id = pcVar6;
  Gia_ManFillValue(_fUseBuffs_local);
  pObj = (Gia_Obj_t *)Abc_NtkCreateNodeConst0((Abc_Ntk_t *)pObjNew);
  uVar3 = Abc_ObjId((Abc_Obj_t *)pObj);
  pGVar7 = Gia_ManConst0(_fUseBuffs_local);
  pGVar7->Value = uVar3;
  iFan = 0;
  while( true ) {
    iVar2 = iFan;
    iVar4 = Gia_ManPiNum(_fUseBuffs_local);
    bVar11 = false;
    if (iVar2 < iVar4) {
      pObjLi = Gia_ManCi(_fUseBuffs_local,iFan);
      bVar11 = pObjLi != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    pAVar5 = Abc_NtkCreatePi((Abc_Ntk_t *)pObjNew);
    uVar3 = Abc_ObjId(pAVar5);
    pObjLi->Value = uVar3;
    iFan = iFan + 1;
  }
  iFan = 0;
  while( true ) {
    iVar2 = iFan;
    iVar4 = Gia_ManPoNum(_fUseBuffs_local);
    bVar11 = false;
    if (iVar2 < iVar4) {
      pObjLi = Gia_ManCo(_fUseBuffs_local,iFan);
      bVar11 = pObjLi != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    pAVar5 = Abc_NtkCreatePo((Abc_Ntk_t *)pObjNew);
    uVar3 = Abc_ObjId(pAVar5);
    pObjLi->Value = uVar3;
    iFan = iFan + 1;
  }
  iFan = 0;
  while( true ) {
    iVar2 = iFan;
    iVar4 = Gia_ManRegNum(_fUseBuffs_local);
    pGVar1 = _fUseBuffs_local;
    bVar11 = false;
    if (iVar2 < iVar4) {
      iVar2 = Gia_ManPoNum(_fUseBuffs_local);
      pObjLo = Gia_ManCo(pGVar1,iVar2 + iFan);
      pGVar1 = _fUseBuffs_local;
      bVar11 = false;
      if (pObjLo != (Gia_Obj_t *)0x0) {
        iVar2 = Gia_ManPiNum(_fUseBuffs_local);
        vReflect = (Vec_Ptr_t *)Gia_ManCi(pGVar1,iVar2 + iFan);
        bVar11 = vReflect != (Vec_Ptr_t *)0x0;
      }
    }
    if (!bVar11) break;
    pObjNewLi = Abc_NtkCreateLatch((Abc_Ntk_t *)pObjNew);
    pObjNewLo = Abc_NtkCreateBi((Abc_Ntk_t *)pObjNew);
    pConst0 = Abc_NtkCreateBo((Abc_Ntk_t *)pObjNew);
    Abc_ObjAddFanin(pObjNewLi,pObjNewLo);
    Abc_ObjAddFanin(pConst0,pObjNewLi);
    uVar3 = Abc_ObjId(pObjNewLo);
    pObjLo->Value = uVar3;
    uVar3 = Abc_ObjId(pConst0);
    *(uint *)&vReflect->pArray = uVar3;
    Abc_LatchSetInit0(pObjNewLi);
    iFan = iFan + 1;
  }
  if (fVerbose == 0) {
    if (_fUseBuffs_local->pMuxes == (uint *)0x0) {
      iVar2 = Gia_ManObjNum(_fUseBuffs_local);
      _k = Vec_PtrStart(iVar2);
      for (iFan = 1; iVar2 = iFan, iVar4 = Gia_ManObjNum(_fUseBuffs_local), iVar2 < iVar4;
          iFan = iFan + 1) {
        iVar2 = Gia_ObjIsLut(_fUseBuffs_local,iFan);
        if (iVar2 != 0) {
          pObjLi = Gia_ManObj(_fUseBuffs_local,iFan);
          if (pObjLi->Value != 0xffffffff) {
            __assert_fail("pObj->Value == ~0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x353,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
          }
          iVar2 = Gia_ObjLutSize(_fUseBuffs_local,iFan);
          if (iVar2 == 0) {
            uVar3 = Abc_ObjId((Abc_Obj_t *)pObj);
            pObjLi->Value = uVar3;
          }
          else {
            pObjNewLi = Abc_NtkCreateNode((Abc_Ntk_t *)pObjNew);
            for (nDupGates = 0; iVar2 = nDupGates, iVar4 = Gia_ObjLutSize(_fUseBuffs_local,iFan),
                iVar2 < iVar4; nDupGates = nDupGates + 1) {
              piVar8 = Gia_ObjLutFanins(_fUseBuffs_local,iFan);
              pAVar10 = pObjNew;
              pAVar5 = pObjNewLi;
              nCountMux = piVar8[nDupGates];
              pGVar7 = Gia_ManObj(_fUseBuffs_local,nCountMux);
              iVar2 = Gia_ObjValue(pGVar7);
              pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
              Abc_ObjAddFanin(pAVar5,pAVar10);
            }
            pHVar9 = Abc_ObjHopFromGia(*(Hop_Man_t **)&pObjNew[3].vFanouts,_fUseBuffs_local,iFan,_k)
            ;
            (pObjNewLi->field_5).pData = pHVar9;
            uVar3 = Abc_ObjId(pObjNewLi);
            pObjLi->Value = uVar3;
          }
        }
      }
      Vec_PtrFree(_k);
    }
    else {
      iFan = 0;
      while( true ) {
        bVar11 = false;
        if (iFan < _fUseBuffs_local->nObjs) {
          pObjLi = Gia_ManObj(_fUseBuffs_local,iFan);
          bVar11 = pObjLi != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        iVar2 = Gia_ObjIsAnd(pObjLi);
        if (iVar2 != 0) {
          pObjNewLi = Abc_NtkCreateNode((Abc_Ntk_t *)pObjNew);
          iVar2 = Gia_ObjIsMuxId(_fUseBuffs_local,iFan);
          pAVar10 = pObjNew;
          pAVar5 = pObjNewLi;
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsXor(pObjLi);
            pAVar10 = pObjNew;
            pAVar5 = pObjNewLi;
            if (iVar2 == 0) {
              pGVar7 = Gia_ObjFanin0(pObjLi);
              iVar2 = Gia_ObjValue(pGVar7);
              pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
              Abc_ObjAddFanin(pAVar5,pAVar10);
              pAVar10 = pObjNew;
              pAVar5 = pObjNewLi;
              pGVar7 = Gia_ObjFanin1(pObjLi);
              iVar2 = Gia_ObjValue(pGVar7);
              pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
              Abc_ObjAddFanin(pAVar5,pAVar10);
              pcVar6 = Abc_SopCreateAnd(*(Mem_Flex_t **)&pObjNew[3].vFanouts,2,(int *)0x0);
              (pObjNewLi->field_5).pData = pcVar6;
              iVar2 = Gia_ObjFaninC0(pObjLi);
              if (iVar2 != 0) {
                Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,0);
              }
              iVar2 = Gia_ObjFaninC1(pObjLi);
              if (iVar2 != 0) {
                Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,1);
              }
            }
            else {
              pGVar7 = Gia_ObjFanin0(pObjLi);
              iVar2 = Gia_ObjValue(pGVar7);
              pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
              Abc_ObjAddFanin(pAVar5,pAVar10);
              pAVar10 = pObjNew;
              pAVar5 = pObjNewLi;
              pGVar7 = Gia_ObjFanin1(pObjLi);
              iVar2 = Gia_ObjValue(pGVar7);
              pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
              Abc_ObjAddFanin(pAVar5,pAVar10);
              pcVar6 = Abc_SopCreateXor(*(Mem_Flex_t **)&pObjNew[3].vFanouts,2);
              (pObjNewLi->field_5).pData = pcVar6;
              iVar2 = Gia_ObjFaninC0(pObjLi);
              if (iVar2 != 0) {
                Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,0);
              }
              iVar2 = Gia_ObjFaninC1(pObjLi);
              if (iVar2 != 0) {
                Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,1);
              }
            }
          }
          else {
            pGVar7 = Gia_ObjFanin2(_fUseBuffs_local,pObjLi);
            iVar2 = Gia_ObjValue(pGVar7);
            pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
            Abc_ObjAddFanin(pAVar5,pAVar10);
            pAVar10 = pObjNew;
            pAVar5 = pObjNewLi;
            pGVar7 = Gia_ObjFanin1(pObjLi);
            iVar2 = Gia_ObjValue(pGVar7);
            pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
            Abc_ObjAddFanin(pAVar5,pAVar10);
            pAVar10 = pObjNew;
            pAVar5 = pObjNewLi;
            pGVar7 = Gia_ObjFanin0(pObjLi);
            iVar2 = Gia_ObjValue(pGVar7);
            pAVar10 = Abc_NtkObj((Abc_Ntk_t *)pAVar10,iVar2);
            Abc_ObjAddFanin(pAVar5,pAVar10);
            pcVar6 = Abc_SopCreateMux(*(Mem_Flex_t **)&pObjNew[3].vFanouts);
            (pObjNewLi->field_5).pData = pcVar6;
            iVar2 = Gia_ObjFaninC2(_fUseBuffs_local,pObjLi);
            if (iVar2 != 0) {
              Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,0);
            }
            iVar2 = Gia_ObjFaninC1(pObjLi);
            if (iVar2 != 0) {
              Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,1);
            }
            iVar2 = Gia_ObjFaninC0(pObjLi);
            if (iVar2 != 0) {
              Abc_SopComplementVar((char *)(pObjNewLi->field_5).pData,2);
            }
          }
          uVar3 = Abc_ObjId(pObjNewLi);
          pObjLi->Value = uVar3;
        }
        iFan = iFan + 1;
      }
    }
  }
  else {
    iFan = 0;
    while( true ) {
      iVar2 = iFan;
      iVar4 = Vec_IntSize(_fUseBuffs_local->vCos);
      bVar11 = false;
      if (iVar2 < iVar4) {
        pObjLi = Gia_ManCo(_fUseBuffs_local,iFan);
        bVar11 = pObjLi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      pObjNewLi = (Abc_Obj_t *)0x0;
      iVar2 = Gia_ObjIsRi(_fUseBuffs_local,pObjLi);
      if (iVar2 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjLi);
        iVar2 = Gia_ObjIsMuxType(pGVar7);
        pGVar1 = _fUseBuffs_local;
        if (iVar2 != 0) {
          iVar2 = Gia_ObjId(_fUseBuffs_local,pObjLi);
          iLitT = Gia_ObjRiToRoId(pGVar1,iVar2);
          pGVar1 = _fUseBuffs_local;
          pGVar7 = Gia_ObjFanin0(pObjLi);
          pObjCtrl._4_4_ = Gia_ObjRecognizeMuxLits(pGVar1,pGVar7,&iTemp,&iCtrl);
          iVar2 = iCtrl;
          iVar4 = Gia_ObjFaninC0(pObjLi);
          iCtrl = Abc_LitNotCond(iVar2,iVar4);
          iVar2 = iTemp;
          iVar4 = Gia_ObjFaninC0(pObjLi);
          iTemp = Abc_LitNotCond(iVar2,iVar4);
          iVar4 = Abc_Lit2Var(iTemp);
          iVar2 = iCtrl;
          if (iVar4 == iLitT) {
            iCtrl = iTemp;
            iTemp = iVar2;
            pObjCtrl._4_4_ = Abc_LitNot(pObjCtrl._4_4_);
          }
          iVar2 = Abc_Lit2Var(iCtrl);
          pGVar1 = _fUseBuffs_local;
          pAVar5 = pObjNew;
          if (iVar2 == iLitT) {
            iVar2 = Abc_Lit2Var(pObjCtrl._4_4_);
            iVar4 = Abc_LitIsCompl(pObjCtrl._4_4_);
            pAVar10 = Abc_NtkFromMappedGia_rec((Abc_Ntk_t *)pAVar5,pGVar1,iVar2,iVar4);
            pGVar1 = _fUseBuffs_local;
            pAVar5 = pObjNew;
            iVar2 = Abc_Lit2Var(iTemp);
            iVar4 = Abc_LitIsCompl(iTemp);
            pFanin = Abc_NtkFromMappedGia_rec((Abc_Ntk_t *)pAVar5,pGVar1,iVar2,iVar4);
            pGVar1 = _fUseBuffs_local;
            pAVar5 = pObjNew;
            iVar2 = Abc_Lit2Var(iCtrl);
            iVar4 = Abc_LitIsCompl(iCtrl);
            pAVar5 = Abc_NtkFromMappedGia_rec((Abc_Ntk_t *)pAVar5,pGVar1,iVar2,iVar4);
            pObjNewLi = Abc_NtkCreateNode((Abc_Ntk_t *)pObjNew);
            Abc_ObjAddFanin(pObjNewLi,pAVar10);
            Abc_ObjAddFanin(pObjNewLi,pFanin);
            Abc_ObjAddFanin(pObjNewLi,pAVar5);
            pcVar6 = Abc_SopCreateMux(*(Mem_Flex_t **)&pObjNew[3].vFanouts);
            (pObjNewLi->field_5).pData = pcVar6;
            iLitE = iLitE + 1;
          }
        }
      }
      pGVar1 = _fUseBuffs_local;
      pAVar5 = pObjNew;
      if (pObjNewLi == (Abc_Obj_t *)0x0) {
        iVar2 = Gia_ObjFaninId0p(_fUseBuffs_local,pObjLi);
        iVar4 = Gia_ObjFaninC0(pObjLi);
        pObjNewLi = Abc_NtkFromMappedGia_rec((Abc_Ntk_t *)pAVar5,pGVar1,iVar2,iVar4);
      }
      pAVar5 = Abc_NtkCo((Abc_Ntk_t *)pObjNew,iFan);
      Abc_ObjAddFanin(pAVar5,pObjNewLi);
      iFan = iFan + 1;
    }
  }
  if (fVerbose == 0) {
    iFan = 0;
    while( true ) {
      iVar2 = iFan;
      iVar4 = Vec_IntSize(_fUseBuffs_local->vCos);
      bVar11 = false;
      if (iVar2 < iVar4) {
        pObjLi = Gia_ManCo(_fUseBuffs_local,iFan);
        bVar11 = pObjLi != (Gia_Obj_t *)0x0;
      }
      pAVar5 = pObjNew;
      if (!bVar11) break;
      pGVar7 = Gia_ObjFanin0(pObjLi);
      iVar2 = Gia_ObjValue(pGVar7);
      pObjNewLi = Abc_NtkObj((Abc_Ntk_t *)pAVar5,iVar2);
      pAVar10 = Abc_NtkCo((Abc_Ntk_t *)pObjNew,iFan);
      pAVar5 = pObjNewLi;
      iVar2 = Gia_ObjFaninC0(pObjLi);
      pAVar5 = Abc_ObjNotCond(pAVar5,iVar2);
      Abc_ObjAddFanin(pAVar10,pAVar5);
      iFan = iFan + 1;
    }
  }
  Abc_NtkAddDummyPiNames((Abc_Ntk_t *)pObjNew);
  Abc_NtkAddDummyPoNames((Abc_Ntk_t *)pObjNew);
  Abc_NtkAddDummyBoxNames((Abc_Ntk_t *)pObjNew);
  iObjRo = Abc_NtkLogicMakeSimpleCos((Abc_Ntk_t *)pObjNew,(uint)((fDuplicate != 0 ^ 0xffU) & 1));
  if (((pNtkNew._4_4_ != 0) && (iObjRo != 0)) &&
     (pcVar6 = Abc_FrameReadFlag("silentmode"), pcVar6 == (char *)0x0)) {
    if ((int)pNtkNew == 0) {
      printf("Added %d buffers/inverters to decouple the CO drivers.\n",(ulong)(uint)iObjRo);
    }
    else {
      printf("Duplicated %d gates to decouple the CO drivers.\n",(ulong)(uint)iObjRo);
    }
  }
  iVar2 = Abc_ObjIsNone((Abc_Obj_t *)pObj);
  if ((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum((Abc_Obj_t *)pObj), iVar2 == 0)) {
    Abc_NtkDeleteObj((Abc_Obj_t *)pObj);
  }
  iVar2 = Gia_ManPiNum(_fUseBuffs_local);
  iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)pObjNew);
  if (iVar2 == iVar4) {
    iVar2 = Gia_ManPoNum(_fUseBuffs_local);
    iVar4 = Abc_NtkPoNum((Abc_Ntk_t *)pObjNew);
    if (iVar2 != iVar4) {
      __assert_fail("Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0x37d,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
    }
    iVar2 = Gia_ManRegNum(_fUseBuffs_local);
    iVar4 = Abc_NtkLatchNum((Abc_Ntk_t *)pObjNew);
    if (iVar2 == iVar4) {
      iVar2 = Abc_NtkCheck((Abc_Ntk_t *)pObjNew);
      if (iVar2 == 0) {
        Abc_Print(1,"Abc_NtkFromMappedGia(): Network check has failed.\n");
      }
      return (Abc_Ntk_t *)pObjNew;
    }
    __assert_fail("Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37e,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  __assert_fail("Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x37c,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs )
{
    int fVerbose = 0;
    int fDuplicate = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjNewLi, * pObjNewLo, * pConst0 = NULL;
    Gia_Obj_t * pObj, * pObjLi, * pObjLo;
    Vec_Ptr_t * vReflect;
    int i, k, iFan, nDupGates, nCountMux = 0; 
    assert( Gia_ManHasMapping(p) || p->pMuxes || fFindEnables );
    assert( !fFindEnables || !p->pMuxes );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, Gia_ManHasMapping(p) ? ABC_FUNC_AIG : ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(p->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(p->pSpec);
    Gia_ManFillValue( p );
    // create constant
    pConst0 = Abc_NtkCreateNodeConst0( pNtkNew );
    Gia_ManConst0(p)->Value = Abc_ObjId(pConst0);
    // create PIs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePi( pNtkNew ) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePo( pNtkNew ) );
    // create as many latches as there are registers in the manager
    Gia_ManForEachRiRo( p, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjNewLi = Abc_NtkCreateBi( pNtkNew );
        pObjNewLo = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, pObjNewLi );
        Abc_ObjAddFanin( pObjNewLo, pObjNew );
        pObjLi->Value = Abc_ObjId( pObjNewLi );
        pObjLo->Value = Abc_ObjId( pObjNewLo );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    if ( fFindEnables )
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            pObjNew = NULL;
            if ( Gia_ObjIsRi(p, pObj) && Gia_ObjIsMuxType(Gia_ObjFanin0(pObj)) )
            {
                int iObjRo = Gia_ObjRiToRoId( p, Gia_ObjId(p, pObj) );
                int iLitE, iLitT, iCtrl = Gia_ObjRecognizeMuxLits( p, Gia_ObjFanin0(pObj), &iLitT, &iLitE );
                iLitE = Abc_LitNotCond( iLitE, Gia_ObjFaninC0(pObj) );
                iLitT = Abc_LitNotCond( iLitT, Gia_ObjFaninC0(pObj) );
                if ( Abc_Lit2Var(iLitT) == iObjRo )
                {
                    int iTemp = iLitE;
                    iLitE = iLitT;
                    iLitT = iTemp;
                    iCtrl = Abc_LitNot( iCtrl );
                }
                if ( Abc_Lit2Var(iLitE) == iObjRo )
                {
                    Abc_Obj_t * pObjCtrl  = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iCtrl), Abc_LitIsCompl(iCtrl) );
                    Abc_Obj_t * pObjNodeT = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitT), Abc_LitIsCompl(iLitT) );
                    Abc_Obj_t * pObjNodeE = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitE), Abc_LitIsCompl(iLitE) );
                    pObjNew = Abc_NtkCreateNode( pNtkNew );
                    Abc_ObjAddFanin( pObjNew, pObjCtrl );
                    Abc_ObjAddFanin( pObjNew, pObjNodeT );
                    Abc_ObjAddFanin( pObjNew, pObjNodeE );
                    pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                    nCountMux++;
                }
            }
            if ( pObjNew == NULL )
                pObjNew = Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
            Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
        }
    }
    else if ( p->pMuxes )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            if ( Gia_ObjIsMuxId(p, i) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin2(p, pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                if ( Gia_ObjFaninC2(p, pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
                if ( Gia_ObjFaninC0(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 2 );
            }
            else if ( Gia_ObjIsXor(pObj) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateXor( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            else 
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            pObj->Value = Abc_ObjId( pObjNew );
        }
    }
    else
    {
        vReflect = Vec_PtrStart( Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            pObj = Gia_ManObj(p, i);
            assert( pObj->Value == ~0 );
            if ( Gia_ObjLutSize(p, i) == 0 )
            {
                pObj->Value = Abc_ObjId(pConst0);
                continue;
            }
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            Gia_LutForEachFanin( p, i, iFan, k )
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ManObj(p, iFan))) );
            pObjNew->pData = Abc_ObjHopFromGia( (Hop_Man_t *)pNtkNew->pManFunc, p, i, vReflect );
            pObj->Value = Abc_ObjId( pObjNew );
        }
        Vec_PtrFree( vReflect );
    }
    //if ( fFindEnables )
    //    printf( "Extracted %d flop enable signals.\n", nCountMux );
    // connect the PO nodes
    if ( !fFindEnables )
    Gia_ManForEachCo( p, pObj, i )
    {
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_ObjNotCond( pObjNew, Gia_ObjFaninC0(pObj) ) );
    }
    // create names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, !fUseBuffs );
    if ( fVerbose && nDupGates && !Abc_FrameReadFlag("silentmode") )
    {
        if ( !fDuplicate )
            printf( "Added %d buffers/inverters to decouple the CO drivers.\n", nDupGates );
        else
            printf( "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    }
    // remove const node if it is not used
    if ( !Abc_ObjIsNone(pConst0) && Abc_ObjFanoutNum(pConst0) == 0 )
        Abc_NtkDeleteObj( pConst0 );

    assert( Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew) );
    assert( Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew) );
    assert( Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew) );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromMappedGia(): Network check has failed.\n" );
    return pNtkNew;
}